

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O2

void __thiscall
moira::Moira::dasmBitImEa<(moira::Instr)29,(moira::Mode)2,1>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  Syntax SVar1;
  Imu<1> im;
  StrWriter *pSVar2;
  Ea<(moira::Mode)2,_1> dst;
  u32 local_34;
  ushort local_30;
  
  im.raw = dasmIncRead<1>(this,addr);
  local_30 = op & 7;
  local_34 = *addr;
  SVar1 = str->style->syntax;
  pSVar2 = StrWriter::operator<<(str);
  StrWriter::operator<<(pSVar2,(Tab)(str->tab).raw);
  if ((SVar1 & ~MOIRA_MIT) == GNU) {
    pSVar2 = StrWriter::operator<<(pSVar2,(Ims<1>)im.raw);
  }
  else {
    pSVar2 = StrWriter::operator<<(pSVar2,im);
  }
  StrWriter::operator<<(pSVar2);
  StrWriter::operator<<(pSVar2,(Ea<(moira::Mode)2,_1> *)&local_34);
  return;
}

Assistant:

void
Moira::dasmBitImEa(StrWriter &str, u32 &addr, u16 op) const
{
    auto src = dasmIncRead<S>(addr);
    auto dst = Op <M,S> ( _____________xxx(op), addr );

    switch (str.style.syntax) {

        case Syntax::GNU:
        case Syntax::GNU_MIT:

            str << Ins<I>{} << str.tab << Ims<S>(src) << Sep{} << dst;
            break;

        default:

            str << Ins<I>{} << str.tab << Imu<S>(src) << Sep{} << dst;
    }
}